

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProceduralBlockVisitor.hpp
# Opt level: O2

void __thiscall
netlist::ProceduralBlockVisitor::connectDeclToVar
          (ProceduralBlockVisitor *this,NetlistVariableReference *varNode,Symbol *symbol)

{
  Netlist *this_00;
  NetlistVariableDeclaration *this_01;
  string_view hierarchicalPath;
  string local_38;
  
  this_00 = this->netlist;
  resolveSymbolHierPath_abi_cxx11_(&local_38,(netlist *)symbol,symbol);
  hierarchicalPath._M_str = local_38._M_dataplus._M_p;
  hierarchicalPath._M_len = local_38._M_string_length;
  this_01 = Netlist::lookupVariable(this_00,hierarchicalPath);
  std::__cxx11::string::~string((string *)&local_38);
  Node<netlist::NetlistNode,_netlist::NetlistEdge>::addEdge
            ((Node<netlist::NetlistNode,_netlist::NetlistEdge> *)this_01,&varNode->super_NetlistNode
            );
  return;
}

Assistant:

void connectDeclToVar(NetlistVariableReference& varNode, ast::Symbol const& symbol) {
        auto* declNode = netlist.lookupVariable(resolveSymbolHierPath(symbol));
        netlist.addEdge(*declNode, varNode);
        DEBUG_PRINT("New edge: declaration {} -> reference {}\n", declNode->hierarchicalPath,
                    varNode.getName());
    }